

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_typed_array_get_length_internal(JSContext *ctx,JSValue obj)

{
  JSValue this_val;
  BOOL BVar1;
  JSObject *p_00;
  undefined8 in_RDX;
  JSContext *in_RSI;
  JSContext *in_RDI;
  JSObject *p;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint32_t uVar2;
  
  this_val.tag._0_4_ = in_stack_fffffffffffffff8;
  this_val.u = (JSValueUnion)in_RDX;
  this_val.tag._4_4_ = in_stack_fffffffffffffffc;
  p_00 = get_typed_array(in_RSI,this_val,(int)((ulong)in_RDI >> 0x20));
  if (p_00 == (JSObject *)0x0) {
    uVar2 = 0xffffffff;
  }
  else {
    BVar1 = typed_array_is_detached(in_RDI,p_00);
    if (BVar1 == 0) {
      uVar2 = (p_00->u).array.count;
    }
    else {
      JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x1b367e);
      uVar2 = 0xffffffff;
    }
  }
  return uVar2;
}

Assistant:

static int js_typed_array_get_length_internal(JSContext *ctx,
                                              JSValueConst obj)
{
    JSObject *p;
    p = get_typed_array(ctx, obj, 0);
    if (!p)
        return -1;
    if (typed_array_is_detached(ctx, p)) {
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        return -1;
    }
    return p->u.array.count;
}